

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal64.c
# Opt level: O2

decimal64 * decimal64FromString(decimal64 *result,char *string,decContext *set)

{
  decNumber_conflict2 dn;
  decContext dc;
  
  decContextDefault(&dc,0x40);
  dc.round = set->round;
  decNumberFromString((decNumber_conflict *)&dn,string,&dc);
  decimal64FromNumber(result,&dn,&dc);
  if (dc.status != 0) {
    decContextSetStatus(set,dc.status);
  }
  return result;
}

Assistant:

decimal64 * decimal64FromString(decimal64 *result, const char *string,
				decContext *set) {
  decContext dc;			     /* work */
  decNumber dn;				     /* .. */

  decContextDefault(&dc, DEC_INIT_DECIMAL64); /* no traps, please */
  dc.round=set->round;			      /* use supplied rounding */

  decNumberFromString(&dn, string, &dc);     /* will round if needed */

  decimal64FromNumber(result, &dn, &dc);
  if (dc.status!=0) {			     /* something happened */
    decContextSetStatus(set, dc.status);     /* .. pass it on */
    }
  return result;
  }